

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O1

EStatusCode __thiscall
CFFFileInput::ReadCFFFile(CFFFileInput *this,IByteReaderWithPosition *inCFFFile)

{
  byte bVar1;
  int iVar2;
  EStatusCode EVar3;
  undefined4 extraout_var;
  Trace *this_00;
  char *inFormat;
  
  FreeData(this);
  CFFPrimitiveReader::SetStream(&this->mPrimitivesReader,inCFFFile);
  iVar2 = (*(inCFFFile->super_IByteReader)._vptr_IByteReader[6])(inCFFFile);
  this->mCFFOffset = CONCAT44(extraout_var,iVar2);
  EVar3 = ReadHeader(this);
  if (EVar3 == eSuccess) {
    bVar1 = (this->mHeader).hdrSize;
    if (4 < bVar1) {
      CFFPrimitiveReader::Skip(&this->mPrimitivesReader,(ulong)(bVar1 - 4));
    }
    EVar3 = ReadNameIndex(this);
    if (EVar3 == eSuccess) {
      EVar3 = ReadTopDictIndex(this);
      inFormat = "CFFFileInput::ReadCFFFile failed to read top index";
      if ((EVar3 == eSuccess) && (EVar3 = ReadStringIndex(this), EVar3 == eSuccess)) {
        EVar3 = ReadGlobalSubrs(this);
        if (EVar3 == eSuccess) {
          EVar3 = ReadCharStrings(this);
          inFormat = "CFFFileInput::ReadCFFFile failed to read charstrings";
          if ((EVar3 == eSuccess) && (EVar3 = ReadPrivateDicts(this), EVar3 == eSuccess)) {
            EVar3 = ReadLocalSubrs(this);
            if (EVar3 == eSuccess) {
              EVar3 = ReadCharsets(this);
              if (EVar3 == eSuccess) {
                EVar3 = ReadEncodings(this);
                if (EVar3 == eSuccess) {
                  EVar3 = ReadCIDInformation(this);
                  if (EVar3 == eSuccess) {
                    return eSuccess;
                  }
                  inFormat = "CFFFileInput::ReadCFFFile failed to read CID Information";
                }
                else {
                  inFormat = "CFFFileInput::ReadCFFFile failed to read encodings";
                }
              }
              else {
                inFormat = "CFFFileInput::ReadCFFFile failed to read char set";
              }
            }
            else {
              inFormat = "CFFFileInput::ReadCFFFile failed to read local subrs";
            }
          }
        }
        else {
          inFormat = "CFFFileInput::ReadCFFFile failed to read global subrs";
        }
      }
    }
    else {
      inFormat = "CFFFileInput::ReadCFFFile Failed to read name";
    }
  }
  else {
    inFormat = "CFFFileInput::ReadCFFFile, Failed to read header";
  }
  this_00 = Trace::DefaultTrace();
  Trace::TraceToLog(this_00,inFormat);
  return EVar3;
}

Assistant:

EStatusCode CFFFileInput::ReadCFFFile(IByteReaderWithPosition* inCFFFile)
{
	EStatusCode status;

	do
	{
		FreeData();

		mPrimitivesReader.SetStream(inCFFFile);
		mCFFOffset = inCFFFile->GetCurrentPosition();

		status = ReadHeader();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile, Failed to read header");
				break;
		}

		// skip to name
		if(mHeader.hdrSize > 4)
			mPrimitivesReader.Skip(mHeader.hdrSize - 4);

		status = ReadNameIndex();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile Failed to read name");
				break;
		}

		status = ReadTopDictIndex();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read top index");
			break;
		}

		status = ReadStringIndex();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read top index");
			break;
		}

		status = ReadGlobalSubrs();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read global subrs");
			break;
		}

		status = ReadCharStrings();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read charstrings");
			break;
		}

		status = ReadPrivateDicts();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read charstrings");
			break;
		}

		status = ReadLocalSubrs();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read local subrs");
			break;
		}

		status = ReadCharsets();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read char set");
			break;
		}

		status = ReadEncodings();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read encodings");
			break;
		}
		
		status = ReadCIDInformation();
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("CFFFileInput::ReadCFFFile failed to read CID Information");
			break;
		}

	}while(false);
	return status;
}